

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O2

void aggr_update(void)

{
  CHAR_DATA *pCVar1;
  ROOM_INDEX_DATA *pRVar2;
  CHAR_DATA *pCVar3;
  CHAR_DATA *pCVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  AFFECT_DATA *pAVar9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  CHAR_DATA *pCVar13;
  CHAR_DATA *ch;
  short sVar14;
  CHAR_DATA *local_1248;
  CHAR_DATA *local_1240;
  char buf [4608];
  
  pCVar1 = char_list;
  do {
    do {
      ch = pCVar1;
      if (ch == (CHAR_DATA *)0x0) {
        return;
      }
      pCVar1 = ch->next;
    } while ((ch->name == (char *)0x0) || (ch->in_room == (ROOM_INDEX_DATA *)0x0));
    bVar5 = is_npc(ch);
    if ((bVar5) && ((ch->progtypes[0] & 0x400) != 0)) {
      (*(code *)ch->pIndexData->mprogs->beat_prog)(ch);
    }
    pAVar9 = (AFFECT_DATA *)&ch->affected;
    while (pAVar9 = pAVar9->next, pAVar9 != (AFFECT_DATA *)0x0) {
      if (pAVar9->beat_fun != (AFF_FUN *)0x0) {
        (*pAVar9->beat_fun)(ch,pAVar9);
      }
    }
    bVar5 = is_npc(ch);
    if ((bVar5) || (sVar14 = ch->pulseTimer, pc_race_table[ch->race].racePulse < sVar14)) {
      bVar5 = is_npc(ch);
      sVar14 = ch->pulseTimer;
      if (sVar14 < 0xd && bVar5) goto LAB_0031adfa;
    }
    else {
LAB_0031adfa:
      sVar14 = sVar14 + 1;
      ch->pulseTimer = sVar14;
    }
    bVar5 = is_affected_by(ch,0x15);
    bVar6 = is_affected_by(ch,0x1d);
    if (ch->fighting != (CHAR_DATA *)0x0) {
      iVar12 = ((uint)bVar5 + (int)sVar14) - (uint)bVar6;
      bVar5 = is_npc(ch);
      if ((bVar5) || (iVar12 < pc_race_table[ch->race].racePulse)) {
        bVar5 = is_npc(ch);
        if ((!bVar5) || (iVar12 < 0xc)) goto LAB_0031aeb5;
      }
      update_pc_last_fight(ch,ch->fighting);
      bVar5 = is_awake(ch);
      if ((bVar5) && (ch->in_room == ch->fighting->in_room)) {
        multi_hit(ch,ch->fighting,-1);
      }
      else {
        stop_fighting(ch,false);
      }
      ch->pulseTimer = 0;
    }
LAB_0031aeb5:
    if ((ch->position == 4) && ((ch->imm_flags[0] & 0x4000000) != 0)) {
      ch->position = 8;
    }
    bVar5 = is_affected_by(ch,0xe);
    if (bVar5) {
      bVar5 = is_awake(ch);
      if ((bVar5) && (ch->fighting == (CHAR_DATA *)0x0)) {
        if (ch->desc == (DESCRIPTOR_DATA *)0x0) {
          bVar5 = is_npc(ch);
          if (!bVar5) goto LAB_0031aefa;
        }
        pCVar3 = ch->in_room->people;
LAB_0031b1db:
        do {
          do {
            do {
              do {
                do {
                  do {
                    do {
                      pCVar13 = pCVar3;
                      if (pCVar13 == (CHAR_DATA *)0x0) goto LAB_0031aefa;
                      pCVar3 = pCVar13->next_in_room;
                    } while (ch == pCVar13);
                    bVar5 = can_see(ch,pCVar13);
                  } while (!bVar5);
                  bVar5 = is_immortal(pCVar13);
                } while (bVar5);
                iVar12 = skill_lookup("radiance");
                bVar5 = is_affected(pCVar13,iVar12);
              } while (bVar5);
              bVar5 = check_stealth(pCVar13,ch);
            } while (bVar5);
            bVar5 = is_safe_new(ch,pCVar13,false);
          } while (bVar5);
          bVar5 = is_same_cabal(ch,pCVar13);
          if (bVar5) {
            iVar12 = number_range(1,10000);
            if (1 < iVar12) goto LAB_0031b1db;
          }
          bVar5 = is_same_group(ch,pCVar13);
          if (bVar5) {
            bVar5 = is_npc(pCVar13);
            if (bVar5) goto LAB_0031b1db;
          }
          bVar5 = is_npc(ch);
          if (!bVar5) break;
          bVar5 = is_affected_by(ch,0x1e);
        } while (bVar5);
        bVar5 = is_same_cabal(ch,pCVar13);
        if ((bVar5) && (ch->in_room->cabal != 3)) {
          pcVar8 = get_char_color(ch,"lightred");
          pcVar10 = END_COLOR(ch);
          pcVar11 = 
          "%sYour thirst for blood overcomes you and you leap at the nearest target!%s\n\r";
        }
        else {
          pcVar8 = get_char_color(ch,"lightred");
          pcVar10 = END_COLOR(ch);
          pcVar11 = "%sYou charge into frenzied battle!%s\n\r";
        }
        sprintf(buf,pcVar11,pcVar8,pcVar10);
        send_to_char(buf,ch);
        do_murder(ch,pCVar13->name);
      }
    }
LAB_0031aefa:
    bVar5 = is_npc(ch);
    if (!bVar5) {
      bVar5 = is_affected(ch,(int)gsn_divine_frenzy);
      if (bVar5) {
        bVar5 = is_awake(ch);
        if ((bVar5) && (ch->fighting == (CHAR_DATA *)0x0)) {
          pCVar3 = ch->in_room->people;
          do {
            do {
              do {
                do {
                  do {
                    pCVar13 = pCVar3;
                    if (pCVar13 == (CHAR_DATA *)0x0) goto LAB_0031af33;
                    pCVar3 = pCVar13->next_in_room;
                    bVar5 = can_see(ch,pCVar13);
                  } while ((ch == pCVar13) || (!bVar5));
                  bVar5 = check_stealth(pCVar13,ch);
                } while (bVar5);
                bVar5 = is_safe_new(ch,pCVar13,false);
              } while (bVar5);
              iVar12 = skill_lookup("radiance");
              bVar5 = is_affected(pCVar13,iVar12);
            } while (bVar5);
            bVar5 = is_evil(pCVar13);
          } while (!bVar5);
          send_to_char("Righteous anger swells within you as you lash out at the wicked!\n\r",ch);
          do_murder(ch,pCVar13->name);
        }
      }
    }
LAB_0031af33:
    bVar5 = is_affected(ch,(int)gsn_mark_of_wrath);
    if (bVar5) {
      bVar5 = is_awake(ch);
      if ((bVar5) && (ch->fighting == (CHAR_DATA *)0x0)) {
        if (ch->desc == (DESCRIPTOR_DATA *)0x0) {
          bVar5 = is_npc(ch);
          if (!bVar5) goto LAB_0031af60;
        }
        pAVar9 = affect_find(ch->affected,(int)gsn_mark_of_wrath);
        pCVar3 = ch->in_room->people;
        do {
          do {
            do {
              do {
                pCVar13 = pCVar3;
                if (pCVar13 == (CHAR_DATA *)0x0) goto LAB_0031af60;
                pCVar3 = pCVar13->next_in_room;
                if (0 < pAVar9->owner->ghost) {
                  affect_remove(ch,pAVar9);
                }
              } while (ch == pCVar13);
              bVar5 = can_see(ch,pCVar13);
            } while (!bVar5);
            iVar12 = skill_lookup("radiance");
            bVar5 = is_affected(pCVar13,iVar12);
          } while (bVar5);
          bVar5 = is_safe_new(ch,pCVar13,false);
        } while ((bVar5) || (pCVar13 != pAVar9->owner));
        pcVar10 = get_char_color(ch,"lightred");
        pcVar8 = pCVar13->name;
        pcVar11 = END_COLOR(ch);
        sprintf(buf,
                "%sCatching sight of the mark upon %s\'s brow, you are consumed with wrath!%s\n\r",
                pcVar10,pcVar8,pcVar11);
        send_to_char(buf,ch);
        do_murder(ch,pCVar13->name);
      }
    }
LAB_0031af60:
    bVar5 = is_npc(ch);
    if ((((!bVar5) && (ch->level < 0x34)) &&
        (pRVar2 = ch->in_room, pRVar2 != (ROOM_INDEX_DATA *)0x0)) && (pRVar2->area->empty == false))
    {
      pCVar3 = pRVar2->people;
LAB_0031afa1:
      pCVar13 = pCVar3;
      if (pCVar13 != (CHAR_DATA *)0x0) {
        pCVar3 = pCVar13->next_in_room;
        bVar5 = is_npc(pCVar13);
        if (((bVar5) && ((pCVar13->act[0] & 0x20) != 0)) &&
           ((pCVar13->in_room->room_flags[0] & 0x400) == 0)) {
          bVar5 = is_npc(pCVar13);
          if (bVar5) {
            bVar5 = is_affected_by(pCVar13,0x1e);
            if (bVar5) goto LAB_0031afa1;
          }
          bVar5 = is_affected_by(pCVar13,0x16);
          if ((!bVar5) && (pCVar13->fighting == (CHAR_DATA *)0x0)) {
            bVar5 = is_affected_by(pCVar13,0x12);
            if (!bVar5) {
              bVar5 = is_awake(pCVar13);
              if (bVar5) {
                if ((pCVar13->act[0] & 0x80) != 0) {
                  bVar5 = is_awake(ch);
                  if (bVar5) goto LAB_0031afa1;
                }
                bVar5 = can_see(pCVar13,ch);
                if (bVar5) {
                  iVar12 = number_bits(1);
                  if (iVar12 != 0) {
                    local_1240 = (CHAR_DATA *)0x0;
                    iVar12 = 0;
                    pCVar4 = ch->in_room->people;
LAB_0031b083:
                    local_1248 = pCVar4;
                    if (local_1248 != (CHAR_DATA *)0x0) {
                      pCVar4 = local_1248->next_in_room;
                      bVar5 = is_npc(local_1248);
                      if ((!bVar5) && (local_1248->level < 0x34)) {
                        bVar5 = is_heroimm(local_1248);
                        if ((!bVar5) && (local_1248->level + -5 <= (int)pCVar13->level)) {
                          if ((pCVar13->act[0] & 0x80) != 0) {
                            bVar5 = is_awake(local_1248);
                            if (bVar5) goto LAB_0031b083;
                          }
                          bVar5 = can_see(pCVar13,local_1248);
                          if (((bVar5) && (2 < sun || (pCVar13->act[1] & 1) == 0)) &&
                             ((ushort)(sun - 3U) < 0xfffe || (pCVar13->act[0] & 0x80000000) == 0)) {
                            bVar5 = is_safe_new(pCVar13,local_1248,false);
                            if (!bVar5) {
                              iVar7 = skill_lookup("radiance");
                              bVar5 = is_affected(local_1248,iVar7);
                              if (!bVar5) {
                                iVar7 = number_range(0,iVar12);
                                if (iVar7 == 0) {
                                  local_1240 = local_1248;
                                }
                                iVar12 = iVar12 + 1;
                              }
                            }
                          }
                        }
                      }
                      goto LAB_0031b083;
                    }
                    if (local_1240 != (CHAR_DATA *)0x0) {
                      multi_hit(pCVar13,local_1240,-1);
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_0031afa1;
      }
    }
  } while( true );
}

Assistant:

void aggr_update(void)
{
	CHAR_DATA *wch;
	CHAR_DATA *wch_next;
	CHAR_DATA *ch;
	CHAR_DATA *ch_next;
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	CHAR_DATA *victim;
	AFFECT_DATA *paf;
	int timer;
	char buf[MAX_STRING_LENGTH];

	for (wch = char_list; wch != nullptr; wch = wch_next)
	{
		wch_next = wch->next;

		if (!wch->name)
			continue;

		if (!wch->in_room)
			continue;

		if (is_npc(wch) && IS_SET(wch->progtypes, MPROG_BEAT))
			(wch->pIndexData->mprogs->beat_prog)(wch);

		for (paf = wch->affected; paf; paf = paf->next)
		{
			if (paf->beat_fun)
				(*paf->beat_fun)(wch, paf);
		}

		if ((!is_npc(wch) && wch->pulseTimer <= pc_race_table[wch->race].racePulse)
			|| (is_npc(wch) && wch->pulseTimer <= 12))
			wch->pulseTimer++;

		timer = wch->pulseTimer;

		if (is_affected_by(wch, AFF_HASTE))
			timer++;

		if (is_affected_by(wch, AFF_SLOW))
			timer--;

		if (wch->fighting &&
			((!is_npc(wch) && timer >= pc_race_table[wch->race].racePulse) || (is_npc(wch) && timer >= 12)))
		{
			update_pc_last_fight(wch, wch->fighting);

			if (is_awake(wch) && wch->in_room == wch->fighting->in_room)
				multi_hit(wch, wch->fighting, TYPE_UNDEFINED);
			else
				stop_fighting(wch, false);

			wch->pulseTimer = 0;
		}

		if (wch->position == POS_SLEEPING && IS_SET(wch->imm_flags, IMM_SLEEP))
			wch->position = POS_STANDING;

		if (is_affected_by(wch, AFF_RAGE) && is_awake(wch) && !wch->fighting && !(wch->desc == nullptr && !is_npc(wch)))
		{
			for (vch = wch->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (wch != vch && can_see(wch, vch) && !is_immortal(vch))
				{
					if (is_affected(vch, skill_lookup("radiance")))
						continue;

					if (check_stealth(vch, wch))
						continue;

					if (is_safe_new(wch, vch, false))
						continue;

					if (is_same_cabal(wch, vch) && number_range(1, 10000) > 1)
						continue;

					if (is_same_group(wch, vch) && is_npc(vch))
						continue;

					if (is_npc(wch) && is_affected_by(wch, AFF_NOSHOW))
						continue;

					if (is_same_cabal(wch, vch) && wch->in_room->cabal != CABAL_HORDE)
					{
						sprintf(buf, "%sYour thirst for blood overcomes you and you leap at the nearest target!%s\n\r",
							get_char_color(wch, "lightred"),
							END_COLOR(wch));
					}
					else
					{
						sprintf(buf, "%sYou charge into frenzied battle!%s\n\r",
							get_char_color(wch, "lightred"),
							END_COLOR(wch));
					}

					send_to_char(buf, wch);
					do_murder(wch, vch->name);
					break;
				}
			}
		}

		if (!is_npc(wch) && is_affected(wch, gsn_divine_frenzy) && is_awake(wch) && !wch->fighting)
		{
			for (vch = wch->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (!can_see(wch, vch) || wch == vch)
					continue;

				if (check_stealth(vch, wch))
					continue;

				if (is_safe_new(wch, vch, false))
					continue;

				if (is_affected(vch, skill_lookup("radiance")))
					continue;

				if (!is_evil(vch))
					continue;

				send_to_char("Righteous anger swells within you as you lash out at the wicked!\n\r", wch);
				do_murder(wch, vch->name);
				break;
			}
		}

		if (is_affected(wch, gsn_mark_of_wrath)
			&& is_awake(wch)
			&& !wch->fighting
			&& !(wch->desc == nullptr && !is_npc(wch)))
		{
			paf = affect_find(wch->affected, gsn_mark_of_wrath);

			for (vch = wch->in_room->people; vch; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (paf->owner->ghost > 0)
					affect_remove(wch, paf);

				if (wch == vch || !can_see(wch, vch))
					continue;

				if (is_affected(vch, skill_lookup("radiance")))
					continue;

				if (is_safe_new(wch, vch, false))
					continue;

				if (vch == paf->owner)
				{
					sprintf(buf, "%sCatching sight of the mark upon %s's brow, you are consumed with wrath!%s\n\r",
						get_char_color(wch, "lightred"),
						vch->name,
						END_COLOR(wch));
					send_to_char(buf, wch);
					do_murder(wch, vch->name);
					break;
				}
			}
		}

		if (is_npc(wch) || wch->level >= LEVEL_IMMORTAL || wch->in_room == nullptr || wch->in_room->area->empty)
			continue;

		for (ch = wch->in_room->people; ch != nullptr; ch = ch_next)
		{
			int count;

			ch_next = ch->next_in_room;

			if (!is_npc(ch)
				|| !IS_SET(ch->act, ACT_AGGRESSIVE)
				|| IS_SET(ch->in_room->room_flags, ROOM_SAFE)
				|| (is_npc(ch) && is_affected_by(ch, AFF_NOSHOW))
				|| is_affected_by(ch, AFF_CALM)
				|| ch->fighting != nullptr
				|| is_affected_by(ch, AFF_CHARM)
				|| !is_awake(ch)
				|| (IS_SET(ch->act, ACT_WIMPY) && is_awake(wch))
				|| !can_see(ch, wch)
				|| number_bits(1) == 0)
			{
				continue;
			}

			/*
			 * Ok we have a 'wch' player character and a 'ch' npc aggressor.
			 * Now make the aggressor fight a RANDOM pc victim in the room,
			 *   giving each 'vch' an equal chance of selection.
			 */
			count = 0;
			victim = nullptr;

			for (vch = wch->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (!is_npc(vch)
					&& vch->level < LEVEL_IMMORTAL
					&& !is_heroimm(vch)
					&& ch->level >= vch->level - 5
					&& (!IS_SET(ch->act, ACT_WIMPY) || !is_awake(vch))
					&& can_see(ch, vch)
					&& (!IS_SET(ch->act, ACT_DIURNAL) || sun >= SolarPosition::Sunset)
					&& (!IS_SET(ch->act, ACT_NOCTURNAL) || (sun != SolarPosition::Sunrise && sun != SolarPosition::Daylight))
					&& !is_safe_new(ch, vch, false)
					&& !is_affected(vch, skill_lookup("radiance")))
				{
					if (number_range(0, count) == 0)
						victim = vch;

					count++;
				}
			}

			if (victim == nullptr)
				continue;

			multi_hit(ch, victim, TYPE_UNDEFINED);
		}
	}
}